

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-dlerror.c
# Opt level: O3

int run_test_dlerror(void)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  char *unaff_RBX;
  undefined1 auStack_e8 [8];
  undefined1 auStack_e0 [40];
  undefined1 auStack_b8 [152];
  char *pcStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_18 = 0;
  uStack_10 = 0;
  pcStack_20 = (char *)0x14dfdb;
  pcVar2 = (char *)uv_dlerror();
  if (pcVar2 == (char *)0x0) {
    pcStack_20 = (char *)0x14e09d;
    run_test_dlerror_cold_9();
LAB_0014e09d:
    pcStack_20 = (char *)0x14e0a2;
    run_test_dlerror_cold_8();
LAB_0014e0a2:
    pcStack_20 = (char *)0x14e0a7;
    run_test_dlerror_cold_1();
LAB_0014e0a7:
    pcStack_20 = (char *)0x14e0ac;
    run_test_dlerror_cold_7();
LAB_0014e0ac:
    pcStack_20 = (char *)0x14e0b1;
    run_test_dlerror_cold_6();
LAB_0014e0b1:
    pcStack_20 = (char *)0x14e0b6;
    run_test_dlerror_cold_2();
LAB_0014e0b6:
    pcVar2 = unaff_RBX;
    pcStack_20 = (char *)0x14e0bb;
    run_test_dlerror_cold_5();
LAB_0014e0bb:
    pcStack_20 = (char *)0x14e0c0;
    run_test_dlerror_cold_4();
  }
  else {
    pcStack_20 = (char *)0x14dff3;
    pcVar2 = strstr(pcVar2,"no error");
    if (pcVar2 == (char *)0x0) goto LAB_0014e09d;
    pcStack_20 = (char *)0x14e00b;
    iVar1 = uv_dlopen("test/fixtures/load_error.node",&local_18);
    if (iVar1 != -1) goto LAB_0014e0a2;
    pcStack_20 = (char *)0x14e01c;
    pcVar2 = (char *)uv_dlerror(&local_18);
    if (pcVar2 == (char *)0x0) goto LAB_0014e0a7;
    pcStack_20 = (char *)0x14e037;
    pcVar3 = strstr(pcVar2,"test/fixtures/load_error.node");
    unaff_RBX = pcVar2;
    if (pcVar3 == (char *)0x0) goto LAB_0014e0ac;
    pcStack_20 = (char *)0x14e04b;
    pcVar2 = strstr(pcVar2,"no error");
    if (pcVar2 != (char *)0x0) goto LAB_0014e0b1;
    pcStack_20 = (char *)0x14e058;
    pcVar2 = (char *)uv_dlerror(&local_18);
    if (pcVar2 == (char *)0x0) goto LAB_0014e0b6;
    pcStack_20 = (char *)0x14e06f;
    pcVar3 = strstr(pcVar2,"test/fixtures/load_error.node");
    if (pcVar3 == (char *)0x0) goto LAB_0014e0bb;
    pcStack_20 = (char *)0x14e083;
    pcVar3 = strstr(pcVar2,"no error");
    if (pcVar3 == (char *)0x0) {
      pcStack_20 = (char *)0x14e090;
      uv_dlclose(&local_18);
      return 0;
    }
  }
  pcStack_20 = "\x0f\x1f";
  run_test_dlerror_cold_3();
  pcStack_20 = pcVar2;
  iov = (uv_buf_t)uv_buf_init(buf,0x20);
  loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_signal_init(loop,auStack_b8);
  if (iVar1 == 0) {
    iVar1 = uv_signal_start(auStack_b8,sig_func,10);
    if (iVar1 != 0) goto LAB_0014e23d;
    iVar1 = pipe(pipe_fds);
    if (iVar1 != 0) goto LAB_0014e242;
    iVar1 = uv_thread_create(auStack_e8,thread_main,auStack_e0);
    if (iVar1 != 0) goto LAB_0014e247;
    iVar1 = uv_fs_read(loop,&read_req,pipe_fds[0],&iov,1,0xffffffffffffffff,0);
    if (iVar1 != 0xd) goto LAB_0014e24c;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_0014e251;
    iVar1 = uv_run(loop,0);
    if (iVar1 != 0) goto LAB_0014e256;
    iVar1 = close(pipe_fds[0]);
    if (iVar1 != 0) goto LAB_0014e25b;
    iVar1 = close(pipe_fds[1]);
    if (iVar1 == 0) {
      uv_close(auStack_b8,0);
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      uv_run(uVar4,0);
      uVar4 = uv_default_loop();
      iVar1 = uv_loop_close(uVar4);
      if (iVar1 == 0) {
        return 0;
      }
      goto <EXTERNAL>_uv_signal_stop;
    }
  }
  else {
    run_test_eintr_handling_cold_1();
LAB_0014e23d:
    run_test_eintr_handling_cold_2();
LAB_0014e242:
    run_test_eintr_handling_cold_3();
LAB_0014e247:
    run_test_eintr_handling_cold_4();
LAB_0014e24c:
    run_test_eintr_handling_cold_5();
LAB_0014e251:
    run_test_eintr_handling_cold_6();
LAB_0014e256:
    run_test_eintr_handling_cold_7();
LAB_0014e25b:
    run_test_eintr_handling_cold_8();
  }
  run_test_eintr_handling_cold_9();
<EXTERNAL>_uv_signal_stop:
  run_test_eintr_handling_cold_10();
  iVar1 = uv_signal_stop();
  return iVar1;
}

Assistant:

TEST_IMPL(dlerror) {
  const char* path = "test/fixtures/load_error.node";
  const char* dlerror_no_error = "no error";
  const char* msg;
  uv_lib_t lib;
  int r;

  lib.errmsg = NULL;
  lib.handle = NULL;
  msg = uv_dlerror(&lib);
  ASSERT(msg != NULL);
  ASSERT(strstr(msg, dlerror_no_error) != NULL);

  r = uv_dlopen(path, &lib);
  ASSERT(r == -1);

  msg = uv_dlerror(&lib);
  ASSERT(msg != NULL);
#ifndef __OpenBSD__
  ASSERT(strstr(msg, path) != NULL);
#endif
  ASSERT(strstr(msg, dlerror_no_error) == NULL);

  /* Should return the same error twice in a row. */
  msg = uv_dlerror(&lib);
  ASSERT(msg != NULL);
#ifndef __OpenBSD__
  ASSERT(strstr(msg, path) != NULL);
#endif
  ASSERT(strstr(msg, dlerror_no_error) == NULL);

  uv_dlclose(&lib);

  return 0;
}